

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onb.h
# Opt level: O2

vec3 * __thiscall onb::transform(onb *this,vec3 *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  vec3 *in_RDI;
  
  dVar1 = v->e[0];
  dVar2 = v->e[1];
  dVar3 = this->axis[0].e[2];
  dVar4 = this->axis[1].e[2];
  dVar5 = v->e[2];
  dVar6 = this->axis[2].e[2];
  dVar7 = this->axis[0].e[1];
  dVar8 = this->axis[1].e[1];
  dVar9 = this->axis[2].e[1];
  in_RDI->e[0] = dVar5 * this->axis[2].e[0] +
                 dVar2 * this->axis[1].e[0] + this->axis[0].e[0] * dVar1;
  in_RDI->e[1] = dVar5 * dVar9 + dVar2 * dVar8 + dVar7 * dVar1;
  in_RDI->e[2] = dVar6 * dVar5 + dVar4 * dVar2 + dVar3 * dVar1;
  return in_RDI;
}

Assistant:

vec3 transform(const vec3& v) const {
        // Transform from basis coordinates to local space.
        return (v[0] * axis[0]) + (v[1] * axis[1]) + (v[2] * axis[2]);
    }